

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PaddingLayerParams::SerializeWithCachedSizes
          (PaddingLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  PaddingLayerParams *this_local;
  
  bVar1 = has_constant(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->PaddingType_).constant_)->super_MessageLite,output);
  }
  bVar1 = has_reflection(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->PaddingType_).constant_)->super_MessageLite,output);
  }
  bVar1 = has_replication(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->PaddingType_).constant_)->super_MessageLite,output);
  }
  bVar1 = has_paddingamounts(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&this->paddingamounts_->super_MessageLite,output);
  }
  return;
}

Assistant:

void PaddingLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.PaddingLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.PaddingLayerParams.PaddingConstant constant = 1;
  if (has_constant()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *PaddingType_.constant_, output);
  }

  // .CoreML.Specification.PaddingLayerParams.PaddingReflection reflection = 2;
  if (has_reflection()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *PaddingType_.reflection_, output);
  }

  // .CoreML.Specification.PaddingLayerParams.PaddingReplication replication = 3;
  if (has_replication()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *PaddingType_.replication_, output);
  }

  // .CoreML.Specification.BorderAmounts paddingAmounts = 10;
  if (this->has_paddingamounts()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *this->paddingamounts_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.PaddingLayerParams)
}